

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

bool __thiscall flatbuffers::go::GoGenerator::generate(GoGenerator *this)

{
  Parser *pPVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  bool bVar4;
  Namespace *ns;
  string filename;
  string code;
  string one_file_code;
  
  one_file_code._M_dataplus._M_p = (pointer)&one_file_code.field_2;
  one_file_code._M_string_length = 0;
  one_file_code.field_2._M_local_buf[0] = '\0';
  bVar4 = generateEnums(this,&one_file_code);
  if (bVar4) {
    bVar4 = generateStructs(this,&one_file_code);
    if (bVar4) {
      bVar4 = true;
      if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&code,"",(allocator<char> *)&filename);
        pPVar1 = (this->super_BaseGenerator).parser_;
        ppEVar2 = (pPVar1->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppEVar3 = (pPVar1->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        BaseGenerator::LastNamespacePart_abi_cxx11_
                  (&filename,(BaseGenerator *)&this->go_namespace_,ns);
        BeginFile(this,&filename,true,ppEVar2 != ppEVar3,&code);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::append((string *)&code);
        BaseGenerator::GeneratedFileName
                  (&filename,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
                   (this->super_BaseGenerator).file_name_,
                   &((this->super_BaseGenerator).parser_)->opts);
        bVar4 = SaveFile(filename._M_dataplus._M_p,&code,false);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&code);
      }
      goto LAB_001a5194;
    }
  }
  bVar4 = false;
LAB_001a5194:
  std::__cxx11::string::~string((string *)&one_file_code);
  return bVar4;
}

Assistant:

bool generate() {
    std::string one_file_code;

    if (!generateEnums(&one_file_code)) return false;
    if (!generateStructs(&one_file_code)) return false;

    if (parser_.opts.one_file) {
      std::string code = "";
      const bool is_enum = !parser_.enums_.vec.empty();
      BeginFile(LastNamespacePart(go_namespace_), true, is_enum, &code);
      code += one_file_code;
      const std::string filename =
          GeneratedFileName(path_, file_name_, parser_.opts);
      return SaveFile(filename.c_str(), code, false);
    }

    return true;
  }